

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_xml_generator.cc
# Opt level: O0

void __thiscall t_xml_generator::init_generator(t_xml_generator *this)

{
  int iVar1;
  char *pcVar2;
  int *piVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  string *__rhs;
  int __oflag;
  allocator local_129;
  string local_128 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  undefined1 local_c8 [8];
  string f_xml_name;
  undefined1 local_98 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38 [36];
  int local_14;
  t_xml_generator *ptStack_10;
  int r;
  t_xml_generator *this_local;
  
  ptStack_10 = this;
  (*(this->super_t_generator)._vptr_t_generator[0x1b])(local_38);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  iVar1 = mkdir(pcVar2,0x1ff);
  std::__cxx11::string::~string(local_38);
  local_14 = iVar1;
  if (iVar1 == -1) {
    piVar3 = __errno_location();
    if (*piVar3 != 0x11) {
      f_xml_name.field_2._M_local_buf[10] = '\x01';
      __return_storage_ptr__ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           __cxa_allocate_exception(0x20);
      (*(this->super_t_generator)._vptr_t_generator[0x1b])(local_98);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_78,pcVar2,(allocator *)(f_xml_name.field_2._M_local_buf + 0xb));
      std::operator+(&local_58,&local_78,": ");
      piVar3 = __errno_location();
      pcVar2 = strerror(*piVar3);
      std::operator+(__return_storage_ptr__,&local_58,pcVar2);
      f_xml_name.field_2._M_local_buf[10] = '\0';
      __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,
                  std::__cxx11::string::~string);
    }
  }
  (*(this->super_t_generator)._vptr_t_generator[0x1b])(&local_108);
  __rhs = t_program::get_name_abi_cxx11_((this->super_t_generator).program_);
  std::operator+(&local_e8,&local_108,__rhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8,
                 &local_e8,".xml");
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_128,pcVar2,&local_129);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::open
            (&this->f_xml_,(char *)local_128,__oflag);
  std::__cxx11::string::~string(local_128);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  this->top_element_is_open = false;
  std::__cxx11::string::~string((string *)local_c8);
  return;
}

Assistant:

void t_xml_generator::init_generator() {
  MKDIR(get_out_dir().c_str());

  string f_xml_name = get_out_dir() + program_->get_name() + ".xml";
  f_xml_.open(f_xml_name.c_str());

  top_element_is_open = false;
}